

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Sphere::getBoundingBox(Sphere *this)

{
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *boundary;
  uint i;
  long lVar1;
  Vector<double,_3U> result;
  Vector3d r;
  
  (boundary->second).super_Vector<double,_3U>.data_[1] = 0.0;
  (boundary->second).super_Vector<double,_3U>.data_[2] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[2] = 0.0;
  (boundary->second).super_Vector<double,_3U>.data_[0] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[0] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[1] = 0.0;
  r.super_Vector<double,_3U>.data_[0] = this->radius_;
  r.super_Vector<double,_3U>.data_[1] = r.super_Vector<double,_3U>.data_[0];
  r.super_Vector<double,_3U>.data_[2] = r.super_Vector<double,_3U>.data_[0];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar1] -
         r.super_Vector<double,_3U>.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (boundary->first).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (boundary->first).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (boundary->first).super_Vector<double,_3U>.data_[1] = result.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar1] +
         r.super_Vector<double,_3U>.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (boundary->second).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (boundary->second).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (boundary->second).super_Vector<double,_3U>.data_[1] = result.data_[1];
  return boundary;
}

Assistant:

std::pair<Vector3d, Vector3d> Sphere::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    Vector3d r(radius_, radius_, radius_);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }